

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void get_range<double,int>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,int *Xc_ind,
               int *Xc_indptr,MissingAction missing_action,double *xmin,double *xmax,
               bool *unsplittable)

{
  long lVar1;
  ulong *puVar2;
  ulong *puVar3;
  int iVar4;
  int iVar5;
  unsigned_long *puVar6;
  int *piVar7;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  ulong local_68;
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  lVar11 = (long)Xc_indptr[col_num];
  lVar10 = (long)Xc_indptr[col_num + 1];
  bVar8 = true;
  if (Xc_indptr[col_num + 1] != Xc_indptr[col_num]) {
    if (Xc_ind[lVar11] <= (int)ix_arr[end]) {
      lVar1 = lVar10 + -1;
      iVar4 = Xc_ind[lVar1];
      if ((int)ix_arr[st] <= iVar4) {
        puVar3 = ix_arr + end;
        uVar9 = (end - st) + 1;
        if (((iVar4 < (int)ix_arr[end]) || ((ulong)(lVar10 - lVar11) < uVar9)) ||
           ((int)ix_arr[st] < Xc_ind[lVar11])) {
          *xmin = 0.0;
          *xmax = 0.0;
        }
        puVar2 = puVar3 + 1;
        if (missing_action == Fail) {
          puVar6 = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>
                             (ix_arr + st,puVar2,Xc_ind + lVar11);
          local_68 = 0;
          do {
            piVar7 = Xc_ind + lVar11;
            while( true ) {
              if (((puVar6 == puVar2) || (lVar11 == lVar10)) || ((ulong)(long)iVar4 < *puVar6))
              goto LAB_00161b11;
              iVar5 = (int)*puVar6;
              if (*piVar7 == iVar5) {
                local_68 = local_68 + 1;
                dVar13 = Xc[lVar11];
                dVar12 = dVar13;
                if (*xmin <= dVar13) {
                  dVar12 = *xmin;
                }
                *xmin = dVar12;
                if (dVar13 <= *xmax) {
                  dVar13 = *xmax;
                }
                *xmax = dVar13;
                if ((puVar6 == puVar3) || (lVar11 == lVar1)) goto LAB_00161b11;
                puVar6 = puVar6 + 1;
                piVar7 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                                   (piVar7,Xc_ind + lVar10,puVar6);
                goto LAB_00161afd;
              }
              if (*piVar7 <= iVar5) break;
              puVar6 = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>
                                 (puVar6 + 1,puVar2,piVar7);
            }
            piVar7 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                               (piVar7 + 1,Xc_ind + lVar10,puVar6);
LAB_00161afd:
            lVar11 = (long)piVar7 - (long)Xc_ind >> 2;
          } while( true );
        }
        puVar6 = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>
                           (ix_arr + st,puVar2,Xc_ind + lVar11);
        local_68 = 0;
        do {
          piVar7 = Xc_ind + lVar11;
          while( true ) {
            if (((puVar6 == puVar2) || (lVar11 == lVar10)) || ((ulong)(long)iVar4 < *puVar6))
            goto LAB_00161b11;
            iVar5 = (int)*puVar6;
            if (*piVar7 == iVar5) {
              local_68 = local_68 + 1;
              dVar13 = Xc[lVar11];
              dVar12 = fmin(*xmin,dVar13);
              *xmin = dVar12;
              dVar13 = fmax(*xmax,dVar13);
              *xmax = dVar13;
              if ((puVar6 == puVar3) || (lVar11 == lVar1)) goto LAB_00161b11;
              puVar6 = puVar6 + 1;
              piVar7 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                                 (piVar7,Xc_ind + lVar10,puVar6);
              goto LAB_00161a1a;
            }
            if (*piVar7 <= iVar5) break;
            puVar6 = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>
                               (puVar6 + 1,puVar2,piVar7);
          }
          piVar7 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                             (piVar7 + 1,Xc_ind + lVar10,puVar6);
LAB_00161a1a:
          lVar11 = (long)piVar7 - (long)Xc_ind >> 2;
        } while( true );
      }
    }
  }
LAB_00161b8c:
  *unsplittable = bVar8;
  return;
LAB_00161b11:
  dVar13 = *xmin;
  bVar8 = true;
  if (local_68 < uVar9) {
    if (0.0 <= dVar13) {
      dVar13 = 0.0;
    }
    *xmin = dVar13;
    dVar12 = *xmax;
    if (dVar12 <= 0.0) {
      dVar12 = 0.0;
    }
    *xmax = dVar12;
  }
  else {
    dVar12 = *xmax;
  }
  if (((dVar13 != dVar12) || (NAN(dVar13) || NAN(dVar12))) &&
     (dVar13 != INFINITY || dVar12 != -INFINITY)) {
    bVar8 = NAN(dVar12);
  }
  goto LAB_00161b8c;
}

Assistant:

void get_range(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    /* ix_arr must already be sorted beforehand */
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1];
    size_t nnz_col = end_col - st_col;
    end_col--;
    size_t curr_pos = st_col;

    if (!nnz_col || 
        Xc_ind[st_col]         >   (sparse_ix)ix_arr[end] || 
        (sparse_ix)ix_arr[st]  >   Xc_ind[end_col]
        )
    {
        unsplittable = true;
        return;
    }

    if (nnz_col < end - st + 1 ||
        Xc_ind[st_col]  > (sparse_ix)ix_arr[st] ||
        Xc_ind[end_col] < (sparse_ix)ix_arr[end]
        )
    {
        xmin = 0;
        xmax = 0;
    }

    size_t ind_end_col = Xc_ind[end_col];
    size_t nmatches = 0;

    if (missing_action == Fail)
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = (Xc[curr_pos] < xmin)? Xc[curr_pos] : xmin;
                xmax = (Xc[curr_pos] > xmax)? Xc[curr_pos] : xmax;
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    else /* can have NAs */
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = std::fmin(xmin, Xc[curr_pos]);
                xmax = std::fmax(xmax, Xc[curr_pos]);
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

    }

    if (nmatches < (end - st + 1))
    {
        xmin = std::fmin(xmin, 0);
        xmax = std::fmax(xmax, 0);
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}